

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_1::TextureLookupSpec::TextureLookupSpec
          (TextureLookupSpec *this,Function function_,Vec4 *minCoord_,Vec4 *maxCoord_,bool useBias_,
          float minLodBias_,float maxLodBias_,Vec3 *minDX_,Vec3 *maxDX_,Vec3 *minDY_,Vec3 *maxDY_,
          bool useOffset_,IVec3 *offset_)

{
  bool useOffset__local;
  Vec3 *minDX__local;
  float maxLodBias__local;
  float minLodBias__local;
  bool useBias__local;
  Vec4 *maxCoord__local;
  Vec4 *minCoord__local;
  Function function__local;
  TextureLookupSpec *this_local;
  
  this->function = function_;
  tcu::Vector<float,_4>::Vector(&this->minCoord,minCoord_);
  tcu::Vector<float,_4>::Vector(&this->maxCoord,maxCoord_);
  this->useBias = useBias_;
  this->minLodBias = minLodBias_;
  this->maxLodBias = maxLodBias_;
  tcu::Vector<float,_3>::Vector(&this->minDX,minDX_);
  tcu::Vector<float,_3>::Vector(&this->maxDX,maxDX_);
  tcu::Vector<float,_3>::Vector(&this->minDY,minDY_);
  tcu::Vector<float,_3>::Vector(&this->maxDY,maxDY_);
  this->useOffset = useOffset_;
  tcu::Vector<int,_3>::Vector(&this->offset,offset_);
  return;
}

Assistant:

TextureLookupSpec (Function				function_,
					   const tcu::Vec4&		minCoord_,
					   const tcu::Vec4&		maxCoord_,
					   bool					useBias_,
					   float				minLodBias_,
					   float				maxLodBias_,
					   const tcu::Vec3&		minDX_,
					   const tcu::Vec3&		maxDX_,
					   const tcu::Vec3&		minDY_,
					   const tcu::Vec3&		maxDY_,
					   bool					useOffset_,
					   const tcu::IVec3&	offset_)
		: function		(function_)
		, minCoord		(minCoord_)
		, maxCoord		(maxCoord_)
		, useBias		(useBias_)
		, minLodBias	(minLodBias_)
		, maxLodBias	(maxLodBias_)
		, minDX			(minDX_)
		, maxDX			(maxDX_)
		, minDY			(minDY_)
		, maxDY			(maxDY_)
		, useOffset		(useOffset_)
		, offset		(offset_)
	{
	}